

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferViewAccessTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_0::BufferViewTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BufferViewTestInstance *this)

{
  VkDevice *ppVVar1;
  Handle<(vk::HandleType)12> HVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  VkAllocationCallbacks *pVVar5;
  Handle<(vk::HandleType)8> HVar6;
  int iVar7;
  VkDevice pVVar8;
  DeviceInterface *pDVar9;
  InstanceInterface *pIVar10;
  VkPhysicalDevice pVVar11;
  ostream *poVar12;
  NotSupportedError *this_00;
  Move<vk::Handle<(vk::HandleType)7>_> memory;
  VkMemoryAllocateInfo memAlloc;
  deUint32 queueFamilyIndex;
  VkMemoryRequirements memReqs;
  VkFormatProperties properties;
  VkBufferCreateInfo bufferParams;
  ostringstream errorMsg;
  Move<vk::Handle<(vk::HandleType)12>_> local_318;
  Move<vk::Handle<(vk::HandleType)8>_> local_2f8;
  VkBufferView local_2d8;
  Deleter<vk::Handle<(vk::HandleType)12>_> DStack_2d0;
  VkDeviceMemory local_2b8;
  Deleter<vk::Handle<(vk::HandleType)7>_> aDStack_2b0 [3];
  VkBuffer local_258;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_250;
  VkMemoryAllocateInfo local_230;
  deUint32 local_20c;
  ulong local_208 [2];
  uint local_1f8;
  undefined1 local_1ec [8];
  uint local_1e4;
  VkBufferCreateInfo local_1e0;
  undefined1 local_1a8 [16];
  VkAllocationCallbacks local_198 [2];
  ios_base local_138 [272];
  
  pVVar8 = Context::getDevice((this->super_TestInstance).m_context);
  pDVar9 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  local_20c = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_1e0.pQueueFamilyIndices = &local_20c;
  DStack_250.m_device = (VkDevice)0x0;
  DStack_250.m_allocator = (VkAllocationCallbacks *)0x0;
  local_258.m_internal = 0;
  DStack_250.m_deviceIface = (DeviceInterface *)0x0;
  local_1e0.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_1e0.pNext = (void *)0x0;
  local_1e0.flags = 0;
  local_1e0.size = 0x1a40;
  local_1e0.usage = (this->m_testCase).usage;
  local_1e0.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_1e0.queueFamilyIndexCount = 1;
  pIVar10 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar11 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  (*pIVar10->_vptr_InstanceInterface[3])(pIVar10,pVVar11,(ulong)(this->m_testCase).format,local_1ec)
  ;
  if ((local_1e4 & (this->m_testCase).features) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiBufferViewCreateTests.cpp"
               ,0x75);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  ::vk::createBuffer(&local_2f8,pDVar9,pVVar8,&local_1e0,(VkAllocationCallbacks *)0x0);
  pVVar5 = local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  pVVar4 = local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pDVar3 = local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  HVar6.m_internal =
       local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_198[0].pUserData =
       local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  local_198[0].pfnAllocation =
       (PFN_vkAllocationFunction)
       local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_1a8._0_8_ = local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_1a8._8_8_ =
       local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_258.m_internal == 0) {
    DStack_250.m_device = pVVar4;
    DStack_250.m_allocator = pVVar5;
    local_258.m_internal = HVar6.m_internal;
    DStack_250.m_deviceIface = pDVar3;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_250,local_258);
    local_258.m_internal = local_1a8._0_8_;
    DStack_250.m_deviceIface = (DeviceInterface *)local_1a8._8_8_;
    DStack_250.m_device = (VkDevice)local_198[0].pUserData;
    DStack_250.m_allocator = (VkAllocationCallbacks *)local_198[0].pfnAllocation;
    if (local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                 (VkBuffer)
                 local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
    }
  }
  (*pDVar9->_vptr_DeviceInterface[0xe])(pDVar9,pVVar8,local_258.m_internal,local_208);
  if (local_208[0] < 0x1a40) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Requied memory size (",0x15);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12," bytes) smaller than the buffer\'s size (",0x28);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," bytes)!",8);
    std::__cxx11::stringbuf::str();
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
               (undefined1 *)
               ((long)&(local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                       m_deviceIface)->_vptr_DeviceInterface +
               local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal));
    if ((VkDevice *)local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
        != &local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device) {
      operator_delete((void *)local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                              m_internal,
                      (ulong)(local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter
                              .m_device + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    aDStack_2b0[0].m_device = (VkDevice)0x0;
    aDStack_2b0[0].m_allocator = (VkAllocationCallbacks *)0x0;
    local_2b8.m_internal = 0;
    aDStack_2b0[0].m_deviceIface = (DeviceInterface *)0x0;
    local_230.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
    local_230.pNext = (void *)0x0;
    local_230.allocationSize = local_208[0];
    if (local_1f8 == 0) {
      local_230.memoryTypeIndex = 0x20;
    }
    else {
      local_230.memoryTypeIndex = 0;
      if (local_1f8 != 0) {
        for (; (local_1f8 >> local_230.memoryTypeIndex & 1) == 0;
            local_230.memoryTypeIndex = local_230.memoryTypeIndex + 1) {
        }
      }
    }
    DStack_2d0.m_device = (VkDevice)0x0;
    DStack_2d0.m_allocator = (VkAllocationCallbacks *)0x0;
    local_2d8.m_internal = 0;
    DStack_2d0.m_deviceIface = (DeviceInterface *)0x0;
    local_1a8._0_4_ = 0xd;
    local_1a8._8_8_ = (DeviceInterface *)0x0;
    local_198[0].pUserData = (void *)((ulong)local_198[0].pUserData & 0xffffffff00000000);
    local_198[0].pfnAllocation = (PFN_vkAllocationFunction)local_258.m_internal;
    local_198[0].pfnReallocation._0_4_ = (this->m_testCase).format;
    local_198[0].pfnFree = (PFN_vkFreeFunction)(this->m_testCase).offset;
    local_198[0].pfnInternalAllocation =
         (PFN_vkInternalAllocationNotification)(this->m_testCase).range;
    ::vk::allocateMemory
              ((Move<vk::Handle<(vk::HandleType)7>_> *)&local_318,pDVar9,pVVar8,&local_230,
               (VkAllocationCallbacks *)0x0);
    pVVar5 = local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
    pVVar4 = local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
    pDVar3 = local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
    HVar2.m_internal =
         local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
    local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
    local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
    local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
    local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
    local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
    local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    if (local_2b8.m_internal == 0) {
      aDStack_2b0[0].m_device = pVVar4;
      aDStack_2b0[0].m_allocator = pVVar5;
      local_2b8.m_internal = HVar2.m_internal;
      aDStack_2b0[0].m_deviceIface = pDVar3;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()(aDStack_2b0,local_2b8);
      local_2b8.m_internal =
           local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
      aDStack_2b0[0].m_deviceIface =
           local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
      aDStack_2b0[0].m_device =
           local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
      aDStack_2b0[0].m_allocator =
           local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
      if (local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)7>_> *)
                   &local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
                   (VkDeviceMemory)
                   local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal
                  );
      }
    }
    iVar7 = (*pDVar9->_vptr_DeviceInterface[0xc])
                      (pDVar9,pVVar8,local_258.m_internal,local_2b8.m_internal);
    if (iVar7 == 0) {
      ::vk::createBufferView
                (&local_318,pDVar9,pVVar8,(VkBufferViewCreateInfo *)local_1a8,
                 (VkAllocationCallbacks *)0x0);
      pVVar5 = local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
      pVVar4 = local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
      pDVar3 = local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface
      ;
      HVar2.m_internal =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
      local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
      local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      if (local_2d8.m_internal == 0) {
        DStack_2d0.m_device = pVVar4;
        DStack_2d0.m_allocator = pVVar5;
        local_2d8.m_internal = HVar2.m_internal;
        DStack_2d0.m_deviceIface = pDVar3;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                  (&DStack_2d0,local_2d8);
        local_2d8.m_internal =
             local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
        DStack_2d0.m_deviceIface =
             local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
        DStack_2d0.m_device =
             local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
        DStack_2d0.m_allocator =
             local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
        if (local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal != 0)
        {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                    (&local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
                     (VkBufferView)
                     local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.
                     m_internal);
        }
      }
      if (local_2d8.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                  (&DStack_2d0,local_2d8);
      }
      DStack_2d0.m_device = (VkDevice)0x0;
      DStack_2d0.m_allocator = (VkAllocationCallbacks *)0x0;
      local_2d8.m_internal = 0;
      DStack_2d0.m_deviceIface = (DeviceInterface *)0x0;
      local_1a8._0_4_ = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
      local_1a8._8_8_ = (DeviceInterface *)0x0;
      local_198[0].pUserData = (void *)((ulong)local_198[0].pUserData & 0xffffffff00000000);
      local_198[0].pfnAllocation = (PFN_vkAllocationFunction)local_258.m_internal;
      local_198[0].pfnReallocation._0_4_ = (this->m_testCase).format;
      local_198[0].pfnFree = (PFN_vkFreeFunction)(this->m_testCase).offset;
      local_198[0].pfnInternalAllocation = (PFN_vkInternalAllocationNotification)0x1a40;
      ::vk::createBufferView
                (&local_318,pDVar9,pVVar8,(VkBufferViewCreateInfo *)local_1a8,
                 (VkAllocationCallbacks *)0x0);
      pVVar5 = local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
      pVVar8 = local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
      pDVar9 = local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface
      ;
      HVar2.m_internal =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device;
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator;
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal;
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
           local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface;
      local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal = 0;
      local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      if (local_2d8.m_internal == 0) {
        DStack_2d0.m_device = pVVar8;
        DStack_2d0.m_allocator = pVVar5;
        local_2d8.m_internal = HVar2.m_internal;
        DStack_2d0.m_deviceIface = pDVar9;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                  (&DStack_2d0,local_2d8);
        local_2d8.m_internal =
             local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
        DStack_2d0.m_deviceIface =
             local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
        DStack_2d0.m_device =
             local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
        DStack_2d0.m_allocator =
             local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
        if (local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.m_internal != 0)
        {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                    (&local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.deleter,
                     (VkBufferView)
                     local_318.super_RefBase<vk::Handle<(vk::HandleType)12>_>.m_data.object.
                     m_internal);
        }
      }
      if (local_2d8.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                  (&DStack_2d0,local_2d8);
      }
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"BufferView test","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_1a8._0_8_,
                 (long)(_func_int ***)local_1a8._8_8_ + local_1a8._0_8_);
      if ((VkAllocationCallbacks *)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198[0].pUserData + 1));
      }
    }
    else {
      ppVVar1 = &local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
      local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
           (deUint64)ppVVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f8,"Bind buffer memory failed!","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,
                 local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                 (undefined1 *)
                 ((long)&(local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                         m_deviceIface)->_vptr_DeviceInterface +
                 local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal));
      if ((VkDevice *)
          local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
          ppVVar1) {
        operator_delete((void *)local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                object.m_internal,
                        (ulong)(local_2f8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                deleter.m_device + 1));
      }
      if (local_2d8.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)12>_>::operator()
                  (&DStack_2d0,local_2d8);
      }
    }
    if (local_2b8.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()(aDStack_2b0,local_2b8);
    }
  }
  if (local_258.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_250,local_258);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BufferViewTestInstance::iterate (void)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();
	const VkSubmitInfo			submitInfo	=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,
		DE_NULL,
		0u,
		(const VkSemaphore*)DE_NULL,
		(const VkPipelineStageFlags*)DE_NULL,
		1u,
		&m_cmdBuffer.get(),
		0u,
		(const VkSemaphore*)DE_NULL,
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity */));

	tcu::TestStatus				testStatus	= checkResult();
	if (testStatus.getCode() != QP_TEST_RESULT_PASS)
	{
		return testStatus;
	}

	// Generate and bind another buffer
	std::vector<deUint32>		uniformData;
	const VkDeviceSize			uniformSize = m_testCase.bufferSize * sizeof(deUint32);
	const deInt8				factor		= 2;

	generateBuffer(uniformData, m_testCase.bufferSize, factor);
	deMemcpy(m_uniformBufferAlloc->getHostPtr(), uniformData.data(), (size_t)uniformSize);

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity */));

	return checkResult(factor);
}